

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O1

void processnonterm(parsenoderec *thisnode)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  parsenoderec *ppVar5;
  int iVar6;
  
  iVar6 = thisnode->level + 1;
  lVar4 = (long)prodtable[thisnode->ParseItem][thistoken];
  currentlevel = iVar6;
  if (lVar4 != 0) {
    iVar1 = prodindex[lVar4].prlength;
    if (iVar1 != 0) {
      iVar2 = prodindex[lVar4].prstart;
      uVar3 = *(undefined8 *)(&DAT_0010c468 + (long)(iVar2 + iVar1) * 8);
      ppVar5 = (parsenoderec *)malloc(0x10);
      ppVar5->level = iVar6;
      ppVar5->TermOrNonterm = (int)uVar3;
      ppVar5->ParseItem = (int)((ulong)uVar3 >> 0x20);
      parsepush(ppVar5);
      iVar6 = iVar2 + iVar1 + -2;
      if (iVar2 <= iVar6) {
        lVar4 = (long)iVar6 + 1;
        do {
          uVar3 = *(undefined8 *)(&DAT_0010c468 + lVar4 * 8);
          ppVar5 = (parsenoderec *)malloc(0x10);
          ppVar5->level = currentlevel;
          ppVar5->TermOrNonterm = (int)uVar3;
          ppVar5->ParseItem = (int)((ulong)uVar3 >> 0x20);
          parsepush(ppVar5);
          lVar4 = lVar4 + -1;
        } while (iVar2 < lVar4);
      }
    }
    return;
  }
  putchar(0x22);
  printlexeme(thistoken);
  printf("%s on line %d\n","\" cannot be used this way",(ulong)(uint)linenum);
  exit(4);
}

Assistant:

void processnonterm(struct parsenoderec *thisnode)
{
    struct parsenoderec	*p;
    int	prodnum, i;
    
    currentlevel = thisnode -> level +1;
    if ((prodnum = prodtable[thisnode -> ParseItem][thistoken]) == 0){
        putchar('\"');
        printlexeme(thistoken);
        error("\" cannot be used this way", linenum);
    }
    
    if (prodindex[prodnum].prlength != 0)	{
        i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 1;
        p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
        parsepush(p);
        
        for (i = prodindex[prodnum].prstart + prodindex[prodnum].prlength - 2;
             i >= prodindex[prodnum].prstart;  --i)	{
            p = getparsenode(prodarray[i].PrTermOrNonterm, prodarray[i].PrParseItem);
            parsepush(p);
        }
    }
    
}